

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntWeakPtr<Diligent::IRenderDevice> * __thiscall
Diligent::RefCntWeakPtr<Diligent::IRenderDevice>::operator=
          (RefCntWeakPtr<Diligent::IRenderDevice> *this,
          RefCntWeakPtr<Diligent::IRenderDevice> *WeakPtr)

{
  if (this->m_pRefCounters != WeakPtr->m_pRefCounters) {
    Release(this);
    this->m_pObject = WeakPtr->m_pObject;
    this->m_pRefCounters = WeakPtr->m_pRefCounters;
    WeakPtr->m_pRefCounters = (RefCountersImpl *)0x0;
    WeakPtr->m_pObject = (IRenderDevice *)0x0;
  }
  return this;
}

Assistant:

RefCntWeakPtr& operator=(RefCntWeakPtr&& WeakPtr) noexcept
    {
        if (*this == WeakPtr)
            return *this;

        Release();
        m_pObject              = std::move(WeakPtr.m_pObject);
        m_pRefCounters         = std::move(WeakPtr.m_pRefCounters);
        WeakPtr.m_pRefCounters = nullptr;
        WeakPtr.m_pObject      = nullptr;
        return *this;
    }